

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int io_popen(lua_State *L)

{
  char *__command;
  char *__modes;
  LStream *pLVar1;
  int *piVar2;
  FILE *pFVar3;
  bool bVar4;
  int local_30;
  LStream *p;
  char *mode;
  char *filename;
  lua_State *L_local;
  
  __command = luaL_checklstring(L,1,(size_t *)0x0);
  __modes = luaL_optlstring(L,2,"r",(size_t *)0x0);
  pLVar1 = newprefile(L);
  if ((*__modes == 'r') || (bVar4 = false, *__modes == 'w')) {
    bVar4 = __modes[1] == '\0';
  }
  if (!bVar4) {
    luaL_argerror(L,2,"invalid mode");
  }
  piVar2 = __errno_location();
  *piVar2 = 0;
  fflush((FILE *)0x0);
  pFVar3 = popen(__command,__modes);
  pLVar1->f = (FILE *)pFVar3;
  pLVar1->closef = io_pclose;
  if (pLVar1->f == (FILE *)0x0) {
    local_30 = luaL_fileresult(L,0,__command);
  }
  else {
    local_30 = 1;
  }
  return local_30;
}

Assistant:

static int io_popen (lua_State *L) {
  const char *filename = luaL_checkstring(L, 1);
  const char *mode = luaL_optstring(L, 2, "r");
  LStream *p = newprefile(L);
  luaL_argcheck(L, l_checkmodep(mode), 2, "invalid mode");
  errno = 0;
  p->f = l_popen(L, filename, mode);
  p->closef = &io_pclose;
  return (p->f == NULL) ? luaL_fileresult(L, 0, filename) : 1;
}